

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierParser.cpp
# Opt level: O2

void __thiscall Refal2::CQualifierParser::addLeftParen(CQualifierParser *this)

{
  bool bVar1;
  allocator local_31;
  string local_30;
  
  bVar1 = (this->builder).negative;
  if (bVar1 == true) {
    std::__cxx11::string::string
              ((string *)&local_30,"unexpected left parenthesis in qualifier",&local_31);
    error(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    (this->builder).negative = (bool)(bVar1 ^ 1);
    this->afterRightParen = false;
  }
  return;
}

Assistant:

void CQualifierParser::addLeftParen()
{
	if( builder.IsNegative() ) {
		error( "unexpected left parenthesis in qualifier" );
	} else {
		builder.AddNegative();
		afterRightParen = false;
	}
}